

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O0

void sysbvm_stackFrame_dumpStackGCRootsToFileNamed(char *filename)

{
  FILE *__stream;
  sysbvm_stackFrameRecord_t *stackBottomRecord;
  FILE *file;
  char *filename_local;
  
  __stream = fopen(filename,"wb");
  stackBottomRecord = sysbvm_stackFrame_getActiveRecord();
  sysbvm_stackFrame_iterateGCRootsInStackWith
            (stackBottomRecord,__stream,sysbvm_stackFrame_dumpStackGCRoots_iteration);
  fclose(__stream);
  return;
}

Assistant:

SYSBVM_API void sysbvm_stackFrame_dumpStackGCRootsToFileNamed(const char *filename)
{
#ifdef _WIN32
    FILE *file = NULL;
    if(fopen_s(&file, filename, "wb"))
        return;
#else
    FILE *file = fopen(filename, "wb");
#endif
    sysbvm_stackFrame_iterateGCRootsInStackWith(sysbvm_stackFrame_getActiveRecord(), file,  sysbvm_stackFrame_dumpStackGCRoots_iteration);
    fclose(file);
}